

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::crn_unpacker::unpack_etc1
          (crn_unpacker *this,uint8 **pDst,uint32 output_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  uint uVar1;
  uint8 auVar2 [4];
  uint8 auVar3 [4];
  block_buffer_element *pbVar4;
  uint32 uVar5;
  uint32 uVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  byte bVar16;
  uint8 (*pauVar17) [4];
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  bool bVar21;
  uint8 e1 [4];
  uint8 e0 [4];
  uint8 block_endpoint [4];
  
  uVar1 = (this->m_color_endpoints).m_size;
  uVar13 = output_width + 1 & 0xfffffffe;
  if ((this->m_block_buffer).m_size < uVar13 * 2) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(&this->m_block_buffer,uVar13 * 2);
  }
  this_00 = &this->m_codec;
  uVar10 = 0;
  uVar20 = 0;
  uVar18 = 0;
  do {
    if ((this->m_pHeader->m_faces).m_buf[0] <= uVar10) {
      return true;
    }
    pauVar17 = (uint8 (*) [4])pDst[uVar10];
    for (uVar9 = 0; uVar9 != (output_height + 1 & 0xfffffffe); uVar9 = uVar9 + 1) {
      bVar21 = uVar9 < output_height;
      for (uVar7 = 0; uVar7 != uVar13; uVar7 = uVar7 + 1) {
        uVar11 = (ulong)(uint)((int)uVar7 * 2);
        pbVar4 = (this->m_block_buffer).m_p;
        if ((uVar9 & 1) != 0) {
          uVar14 = (uint)(byte)pbVar4[uVar11].endpoint_reference;
          switch(uVar14 & 3) {
          case 0:
            goto switchD_001135c3_caseD_0;
          case 1:
            goto switchD_001135c3_caseD_1;
          case 2:
            goto switchD_001135c3_caseD_2;
          }
          goto switchD_001135c3_caseD_3;
        }
        uVar5 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
        uVar14 = uVar5 >> 2 & 0xc;
        pbVar4[uVar11].endpoint_reference = (ushort)(uVar5 >> 4) & 0xc | (ushort)(uVar5 >> 2) & 3;
        switch(uVar5 & 3) {
        case 0:
switchD_001135c3_caseD_0:
          uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
          uVar20 = uVar1;
          if (uVar5 + uVar18 < uVar1) {
            uVar20 = 0;
          }
          uVar20 = (uVar5 + uVar18) - uVar20;
          break;
        case 1:
switchD_001135c3_caseD_1:
          uVar20 = uVar18;
          break;
        case 2:
switchD_001135c3_caseD_2:
          uVar18 = (uint)pbVar4[uVar11].color_endpoint_index;
          goto LAB_00113617;
        }
switchD_001135c3_caseD_3:
        pbVar4[uVar11].color_endpoint_index = (uint16)uVar20;
        uVar18 = uVar20;
LAB_00113617:
        uVar19 = (ulong)uVar18;
        auVar2 = *(uint8 (*) [4])((this->m_color_endpoints).m_p + uVar19);
        e0 = auVar2;
        uVar5 = symbol_codec::decode(this_00,this->m_selector_delta_dm);
        if ((uVar14 & 0xfc) != 0) {
          uVar6 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
          uVar20 = uVar1;
          if (uVar6 + uVar18 < uVar1) {
            uVar20 = 0;
          }
          uVar18 = (uVar6 + uVar18) - uVar20;
          uVar19 = (ulong)uVar18;
        }
        bVar21 = (bool)(bVar21 & uVar7 < output_width);
        pbVar4 = (this->m_block_buffer).m_p;
        uVar20 = (uint)pbVar4[uVar11 | 1].color_endpoint_index;
        pbVar4[uVar11 + 1].color_endpoint_index = (uint16)uVar18;
        auVar3 = *(uint8 (*) [4])((this->m_color_endpoints).m_p + uVar19);
        e1[0] = auVar3[0];
        e1[1] = auVar3[1];
        e1[2] = auVar3[2];
        e1[3] = auVar3[3];
        if (bVar21) {
          bVar8 = true;
          for (uVar11 = 0; (bVar8 && (uVar11 < 3)); uVar11 = uVar11 + 1) {
            bVar8 = (uint)e0[uVar11] <= e1[uVar11] + 4 && (uint)e1[uVar11] <= e0[uVar11] + 3;
          }
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            bVar15 = e0[lVar12] * '\b';
            if (bVar8) {
              bVar16 = e1[lVar12] - e0[lVar12] & 7;
            }
            else {
              bVar15 = bVar15 & 0xf0;
              bVar16 = e1[lVar12] >> 1;
            }
            block_endpoint[lVar12] = bVar16 | bVar15;
          }
          uVar14 = uVar14 >> 3 ^ 1;
          block_endpoint[3] =
               ((byte)((uint)auVar3 >> 0x16) & 0xfc | (byte)((uint)auVar2 >> 0x13) & 0xe0) +
               bVar8 * '\x02' | (byte)uVar14;
          *pauVar17 = block_endpoint;
          pauVar17[1] = *(uint8 (*) [4])((this->m_color_selectors).m_p + (uVar5 * 2 | uVar14));
        }
        pauVar17 = pauVar17 + 2;
      }
      pauVar17 = pauVar17 + (int)((output_pitch_in_bytes >> 2) + uVar13 * -2);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool unpack_etc1(uint8** pDst, uint32 output_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_color_endpoints = m_color_endpoints.size();
    const uint32 width = (output_width + 1) & ~1;
    const uint32 height = (output_height + 1) & ~1;
    const int32 delta_pitch_in_dwords = (output_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width << 1)
      m_block_buffer.resize(width << 1);

    uint32 color_endpoint_index = 0, diagonal_color_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          block_buffer_element &buffer = m_block_buffer[x << 1];
          uint8 endpoint_reference, block_endpoint[4], e0[4], e1[4];
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            reference_group = m_codec.decode(m_reference_encoding_dm);
            endpoint_reference = (reference_group & 3) | (reference_group >> 2 & 12);
            buffer.endpoint_reference = (reference_group >> 2 & 3) | (reference_group >> 4 & 12);
          }
          if (!(endpoint_reference & 3)) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
            buffer.color_endpoint_index = color_endpoint_index;
          } else if ((endpoint_reference & 3) == 1) {
            buffer.color_endpoint_index = color_endpoint_index;
          } else if ((endpoint_reference & 3) == 3) {
            buffer.color_endpoint_index = color_endpoint_index = diagonal_color_endpoint_index;
          } else {
            color_endpoint_index = buffer.color_endpoint_index;
          }
          endpoint_reference >>= 2;
          *(uint32*)&e0 = m_color_endpoints[color_endpoint_index];
          uint32 selector_index = m_codec.decode(m_selector_delta_dm[0]);
          if (endpoint_reference) {
            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
            if (color_endpoint_index >= num_color_endpoints)
              color_endpoint_index -= num_color_endpoints;
          }
          diagonal_color_endpoint_index = m_block_buffer[x << 1 | 1].color_endpoint_index;
          m_block_buffer[x << 1 | 1].color_endpoint_index = color_endpoint_index;
          *(uint32*)&e1 = m_color_endpoints[color_endpoint_index];
          if (visible) {
            uint32 flip = endpoint_reference >> 1 ^ 1, diff = 1;
            for (uint c = 0; diff && c < 3; c++)
              diff = e0[c] + 3 >= e1[c] && e1[c] + 4 >= e0[c] ? diff : 0;
            for (uint c = 0; c < 3; c++)
              block_endpoint[c] = diff ? e0[c] << 3 | ((e1[c] - e0[c]) & 7) : (e0[c] << 3 & 0xF0) | e1[c] >> 1;
            block_endpoint[3] = e0[3] << 5 | e1[3] << 2 | diff << 1 | flip;
            pData[0] = *(uint32*)&block_endpoint;
            pData[1] = m_color_selectors[selector_index << 1 | flip];
          }
        }
      }
    }
    return true;
  }